

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O3

bool Js::JavascriptConversion::SameValueCommon<false>(Var aLeft,Var aRight)

{
  uint32 uVar1;
  code *pcVar2;
  double dVar3;
  bool bVar4;
  BOOL BVar5;
  int32 iVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  JavascriptString *aLeft_00;
  JavascriptString *aRight_00;
  JavascriptSymbol *pJVar9;
  JavascriptSymbol *pJVar10;
  JavascriptTypedNumber<long> *pJVar11;
  JavascriptTypedNumber<unsigned_long> *pJVar12;
  uint32 *puVar13;
  Type TVar14;
  Type TVar15;
  Type typeId;
  undefined4 local_58;
  undefined4 uStack_54;
  double local_40;
  double dblLeft;
  double dblRight;
  
  if (aLeft == aRight) {
    return true;
  }
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00a90b02;
    *puVar7 = 0;
LAB_00a904be:
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00a90b02;
      *puVar7 = 0;
    }
    typeId = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00a90b02;
LAB_00a9058f:
      *puVar7 = 0;
    }
  }
  else {
    if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00a90b02;
      typeId = TypeIds_FirstNumberType;
      goto LAB_00a9058f;
    }
    typeId = TypeIds_FirstNumberType;
    if ((((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) &&
       (typeId = TypeIds_Number, (ulong)aLeft >> 0x32 == 0)) goto LAB_00a904be;
  }
  BVar5 = JavascriptOperators::IsUndefinedOrNullType(typeId);
  if (BVar5 != 0) {
    return false;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00a90b02;
    *puVar7 = 0;
LAB_00a906c6:
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00a90b02;
      *puVar7 = 0;
    }
    TVar14 = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)TVar14) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00a90b02;
LAB_00a90798:
      *puVar7 = 0;
    }
  }
  else {
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00a90b02;
      TVar14 = TypeIds_FirstNumberType;
      goto LAB_00a90798;
    }
    TVar14 = TypeIds_FirstNumberType;
    if ((((ulong)aRight & 0xffff000000000000) != 0x1000000000000) &&
       (TVar14 = TypeIds_Number, (ulong)aRight >> 0x32 == 0)) goto LAB_00a906c6;
  }
  switch(typeId) {
  case TypeIds_FirstNumberType:
    if (TVar14 == TypeIds_LastNumberType) {
      iVar6 = TaggedInt::ToInt32(aLeft);
      pJVar11 = VarTo<Js::JavascriptTypedNumber<long>>(aRight);
LAB_00a9097d:
      return pJVar11->m_value == (long)iVar6;
    }
    if (TVar14 == TypeIds_Int64Number) {
      iVar6 = TaggedInt::ToInt32(aLeft);
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
      goto LAB_00a9097d;
    }
    if (TVar14 != TypeIds_Number) {
      return false;
    }
    local_40 = (double)(int)aLeft;
    break;
  case TypeIds_Number:
    switch(TVar14) {
    case TypeIds_FirstNumberType:
      local_40 = JavascriptNumber::GetValue(aLeft);
      local_58 = SUB84(local_40,0);
      uStack_54 = (undefined4)((ulong)local_40 >> 0x20);
      dblLeft = (double)(int)aRight;
      break;
    case TypeIds_Number:
      local_40 = JavascriptNumber::GetValue(aLeft);
      goto LAB_00a90a90;
    case TypeIds_Int64Number:
      dVar3 = JavascriptNumber::GetValue(aLeft);
      local_40 = dVar3;
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
      local_58 = SUB84(dVar3,0);
      uStack_54 = (undefined4)((ulong)dVar3 >> 0x20);
      dblLeft = (double)pJVar11->m_value;
      break;
    case TypeIds_LastNumberType:
      dVar3 = JavascriptNumber::GetValue(aLeft);
      local_40 = dVar3;
      pJVar12 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      local_58 = SUB84(dVar3,0);
      uStack_54 = (undefined4)((ulong)dVar3 >> 0x20);
      dblLeft = ((double)CONCAT44(0x43300000,(int)pJVar12->m_value) - 4503599627370496.0) +
                ((double)CONCAT44(0x45300000,(int)(pJVar12->m_value >> 0x20)) -
                1.9342813113834067e+25);
      break;
    default:
      goto switchD_00a907dc_default;
    }
    goto LAB_00a90aaa;
  case TypeIds_Int64Number:
    switch(TVar14) {
    case TypeIds_FirstNumberType:
      pJVar12 = (JavascriptTypedNumber<unsigned_long> *)
                UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
LAB_00a90884:
      TVar15 = pJVar12->m_value;
      iVar6 = TaggedInt::ToInt32(aRight);
      return TVar15 == (long)iVar6;
    case TypeIds_Number:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
      local_40 = (double)pJVar11->m_value;
      break;
    case TypeIds_Int64Number:
      pJVar12 = (JavascriptTypedNumber<unsigned_long> *)
                UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
LAB_00a909a5:
      TVar15 = pJVar12->m_value;
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
LAB_00a90a08:
      return TVar15 == pJVar11->m_value;
    case TypeIds_LastNumberType:
      pJVar12 = (JavascriptTypedNumber<unsigned_long> *)
                UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
LAB_00a909fc:
      TVar15 = pJVar12->m_value;
      pJVar11 = VarTo<Js::JavascriptTypedNumber<long>>(aRight);
      goto LAB_00a90a08;
    default:
      goto switchD_00a907dc_default;
    }
    break;
  case TypeIds_LastNumberType:
    switch(TVar14) {
    case TypeIds_FirstNumberType:
      pJVar12 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      goto LAB_00a90884;
    case TypeIds_Number:
      pJVar12 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      local_40 = ((double)CONCAT44(0x43300000,(int)pJVar12->m_value) - 4503599627370496.0) +
                 ((double)CONCAT44(0x45300000,(int)(pJVar12->m_value >> 0x20)) -
                 1.9342813113834067e+25);
      break;
    case TypeIds_Int64Number:
      pJVar12 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      goto LAB_00a909a5;
    case TypeIds_LastNumberType:
      pJVar12 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      goto LAB_00a909fc;
    default:
      goto switchD_00a907dc_default;
    }
    break;
  case TypeIds_String:
    if (TVar14 != TypeIds_String) {
      return false;
    }
    aLeft_00 = UnsafeVarTo<Js::JavascriptString>(aLeft);
    aRight_00 = UnsafeVarTo<Js::JavascriptString>(aRight);
    bVar4 = JavascriptString::Equals(aLeft_00,aRight_00);
    return bVar4;
  case TypeIds_Symbol:
    if (TVar14 == TypeIds_Symbol) {
      pJVar9 = UnsafeVarTo<Js::JavascriptSymbol>(aLeft);
      pJVar10 = UnsafeVarTo<Js::JavascriptSymbol>(aRight);
      if ((pJVar9->propertyRecordUsageCache).propertyRecord.ptr ==
          (pJVar10->propertyRecordUsageCache).propertyRecord.ptr) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                    ,0xd2,"(leftSymbol->GetValue() != rightSymbol->GetValue())",
                                    "leftSymbol->GetValue() != rightSymbol->GetValue()");
        if (!bVar4) {
LAB_00a90b02:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
  default:
    goto switchD_00a907dc_default;
  }
LAB_00a90a90:
  dVar3 = local_40;
  dblLeft = JavascriptNumber::GetValue(aRight);
  local_58 = SUB84(dVar3,0);
  uStack_54 = (undefined4)((ulong)dVar3 >> 0x20);
LAB_00a90aaa:
  dVar3 = dblLeft;
  bVar4 = NumberUtilities::IsNan((double)CONCAT44(uStack_54,local_58));
  if ((bVar4) && (bVar4 = NumberUtilities::IsNan(dVar3), bVar4)) {
    return true;
  }
  puVar13 = NumberUtilities::LuLoDbl(&local_40);
  uVar1 = *puVar13;
  puVar13 = NumberUtilities::LuLoDbl(&dblLeft);
  if (uVar1 == *puVar13) {
    puVar13 = NumberUtilities::LuHiDbl(&local_40);
    uVar1 = *puVar13;
    puVar13 = NumberUtilities::LuHiDbl(&dblLeft);
    return uVar1 == *puVar13;
  }
switchD_00a907dc_default:
  return false;
}

Assistant:

bool JavascriptConversion::SameValueCommon(Var aLeft, Var aRight)
    {
        if (aLeft == aRight)
        {
            return true;
        }

        TypeId leftType = JavascriptOperators::GetTypeId(aLeft);

        if (JavascriptOperators::IsUndefinedOrNullType(leftType))
        {
            return false;
        }

        TypeId rightType = JavascriptOperators::GetTypeId(aRight);
        double dblLeft, dblRight;

        switch (leftType)
        {
        case TypeIds_Integer:
            switch (rightType)
            {
            case TypeIds_Integer:
                return false;
            case TypeIds_Number:
                dblLeft     = TaggedInt::ToDouble(aLeft);
                dblRight    = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                {
                int leftValue = TaggedInt::ToInt32(aLeft);
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            case TypeIds_UInt64Number:
                {
                int leftValue = TaggedInt::ToInt32(aLeft);
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            }
            break;
        case TypeIds_Int64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                int rightValue = TaggedInt::ToInt32(aRight);
                return leftValue == rightValue;
                }
            case TypeIds_Number:
                dblLeft     = (double)UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight    = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            case TypeIds_UInt64Number:
                {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                return ((unsigned __int64)leftValue == rightValue);
                }
            }
            break;
        case TypeIds_UInt64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = TaggedInt::ToInt32(aRight);
                return (leftValue == (unsigned __int64)rightValue);
                }
            case TypeIds_Number:
                dblLeft     = (double)UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight    = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return (leftValue == (unsigned __int64)rightValue);
                }
            case TypeIds_UInt64Number:
                {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            }
            break;
        case TypeIds_Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = TaggedInt::ToDouble(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = (double)UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_UInt64Number:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = (double)UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_Number:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = JavascriptNumber::GetValue(aRight);
CommonNumber:
                if (JavascriptNumber::IsNan(dblLeft) && JavascriptNumber::IsNan(dblRight))
                {
                    return true;
                }

                if (zero)
                {
                    // SameValueZero(+0,-0) returns true;
                    return dblLeft == dblRight;
                }
                else
                {
                    // SameValue(+0,-0) returns false;
                    return (NumberUtilities::LuLoDbl(dblLeft) == NumberUtilities::LuLoDbl(dblRight) &&
                        NumberUtilities::LuHiDbl(dblLeft) == NumberUtilities::LuHiDbl(dblRight));
                }
            }
            break;
        case TypeIds_Boolean:
            return false;
        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_String:
                return JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
            }
            break;
#if DBG
        case TypeIds_Symbol:
            if (rightType == TypeIds_Symbol)
            {
                JavascriptSymbol* leftSymbol = UnsafeVarTo<JavascriptSymbol>(aLeft);
                JavascriptSymbol* rightSymbol = UnsafeVarTo<JavascriptSymbol>(aRight);
                Assert(leftSymbol->GetValue() != rightSymbol->GetValue());
            }
#endif
        default:
            break;
        }
        return false;
    }